

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O0

TypeInfos * anon_unknown.dwarf_1f46971::TypeInfos::get(void)

{
  int iVar1;
  TypeInfos *pTVar2;
  
  if ((anonymous_namespace)::TypeInfos::get()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::TypeInfos::get()::instance);
    if (iVar1 != 0) {
      get::Instance::Instance((Instance *)&(anonymous_namespace)::TypeInfos::get()::instance);
      __cxa_atexit(get::Instance::~Instance,&(anonymous_namespace)::TypeInfos::get()::instance,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::TypeInfos::get()::instance);
    }
  }
  pTVar2 = get::Instance::ptr((Instance *)&(anonymous_namespace)::TypeInfos::get()::instance);
  return pTVar2;
}

Assistant:

TypeInfos* TypeInfos::get() {
  static aligned_storage<sizeof(TypeInfos), alignof(TypeInfos)>::type memory;

  struct Instance {
    TypeInfos* ptr() { return reinterpret_cast<TypeInfos*>(memory.data); }
    Instance() { new (ptr()) TypeInfos(); }
    ~Instance() { ptr()->release(); }
  };

  static Instance instance;
  return instance.ptr();
}